

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# character.cpp
# Opt level: O1

bool character_equip_twoslot
               (Character *character,short item,uchar subloc,EquipLocation slot1,EquipLocation slot2
               )

{
  ulong uVar1;
  undefined7 in_register_00000011;
  bool bVar2;
  
  if ((int)CONCAT71(in_register_00000011,subloc) == 0) {
    uVar1 = (ulong)slot1;
  }
  else {
    uVar1 = (ulong)slot2;
  }
  bVar2 = (character->paperdoll)._M_elems[uVar1] == 0;
  if (bVar2) {
    (character->paperdoll)._M_elems[uVar1] = (int)item;
    Character::DelItem(character,item,1);
    Character::CalculateStats(character,true);
  }
  return bVar2;
}

Assistant:

static bool character_equip_twoslot(Character *character, short item, unsigned char subloc, Character::EquipLocation slot1, Character::EquipLocation slot2)
{
	if (subloc == 0)
	{
		if (character->paperdoll[slot1] != 0)
		{
			return false;
		}

		character->paperdoll[slot1] = item;
		character->DelItem(item, 1);
	}
	else
	{
		if (character->paperdoll[slot2] != 0)
		{
			return false;
		}

		character->paperdoll[slot2] = item;
		character->DelItem(item, 1);
	}

	character->CalculateStats();
	return true;
}